

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O2

void __thiscall
duckdb::RadixPartitionedColumnData::RadixPartitionedColumnData
          (RadixPartitionedColumnData *this,RadixPartitionedColumnData *other)

{
  idx_t iVar1;
  idx_t iVar2;
  ulong uVar3;
  
  PartitionedColumnData::PartitionedColumnData
            (&this->super_PartitionedColumnData,&other->super_PartitionedColumnData);
  (this->super_PartitionedColumnData)._vptr_PartitionedColumnData =
       (_func_int **)&PTR__RadixPartitionedColumnData_027a6c08;
  iVar2 = other->radix_bits;
  iVar1 = other->hash_col_idx;
  this->radix_bits = other->radix_bits;
  this->hash_col_idx = iVar1;
  for (uVar3 = 0; uVar3 >> ((byte)iVar2 & 0x3f) == 0; uVar3 = uVar3 + 1) {
    PartitionedColumnData::CreatePartitionCollection
              ((PartitionedColumnData *)&stack0xffffffffffffffd8,(idx_t)this);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>
                *)&(this->super_PartitionedColumnData).partitions,
               (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                *)&stack0xffffffffffffffd8);
    ::std::
    unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                 *)&stack0xffffffffffffffd8);
    iVar2 = this->radix_bits;
  }
  return;
}

Assistant:

RadixPartitionedColumnData::RadixPartitionedColumnData(const RadixPartitionedColumnData &other)
    : PartitionedColumnData(other), radix_bits(other.radix_bits), hash_col_idx(other.hash_col_idx) {
	for (idx_t i = 0; i < RadixPartitioning::NumberOfPartitions(radix_bits); i++) {
		partitions.emplace_back(CreatePartitionCollection(i));
	}
}